

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testSerializeFromStringAndValidateNewOrderSingle(int count)

{
  undefined1 *puVar1;
  __time_t _Var2;
  __suseconds_t _Var3;
  long lVar4;
  string string;
  Symbol symbol;
  ClOrdID clOrdID;
  NewOrderSingle message;
  TransactTime transactTime;
  Side side;
  HandlInst handlInst;
  OrdType ordType;
  long *local_3f0 [2];
  long local_3e0 [2];
  timeval local_3d0;
  undefined1 local_3c0 [16];
  _Alloc_hider local_3b0;
  char local_3a0 [16];
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  size_t local_370;
  int local_368;
  undefined1 local_360 [16];
  _Alloc_hider local_350;
  char local_340 [16];
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  size_t local_310;
  int local_308;
  NewOrderSingle local_300;
  FieldBase local_1a8;
  FieldBase local_148;
  FieldBase local_e8;
  FieldBase local_88;
  
  puVar1 = &local_300.super_Message.field_0x10;
  local_300.super_Message._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"ORDERID","");
  local_360._0_8_ = &PTR__FieldBase_0011c5d8;
  local_360._8_4_ = 0xb;
  local_350._M_p = local_340;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,local_300.super_Message._0_8_,
             (undefined1 *)(local_300.super_Message._0_8_ + local_300.super_Message._8_8_));
  local_330._M_p = (pointer)&local_320;
  local_328 = 0;
  local_320._M_local_buf[0] = '\0';
  local_310 = 0;
  local_308 = 0;
  local_360._0_8_ = &PTR__FieldBase_0011c658;
  if ((undefined1 *)local_300.super_Message._0_8_ != puVar1) {
    operator_delete((void *)local_300.super_Message._0_8_,local_300.super_Message._16_8_ + 1);
  }
  FIX::CharField::CharField((CharField *)&local_e8,0x15,'1');
  local_e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c690;
  local_300.super_Message._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"LNUX","");
  local_3c0._0_8_ = &PTR__FieldBase_0011c5d8;
  local_3c0._8_4_ = 0x37;
  local_3b0._M_p = local_3a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,local_300.super_Message._0_8_,
             (undefined1 *)(local_300.super_Message._0_8_ + local_300.super_Message._8_8_));
  local_390._M_p = (pointer)&local_380;
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_370 = 0;
  local_368 = 0;
  local_3c0._0_8_ = &PTR__FieldBase_0011c700;
  if ((undefined1 *)local_300.super_Message._0_8_ != puVar1) {
    operator_delete((void *)local_300.super_Message._0_8_,local_300.super_Message._16_8_ + 1);
  }
  FIX::CharField::CharField((CharField *)&local_148,0x36,'1');
  local_148._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c738;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)&local_1a8,0x3c,0);
  local_1a8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c770;
  FIX::CharField::CharField((CharField *)&local_88,0x28,'1');
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c848;
  FIX42::NewOrderSingle::NewOrderSingle
            (&local_300,(ClOrdID *)local_360,(HandlInst *)&local_e8,(Symbol *)local_3c0,
             (Side *)&local_148,(TransactTime *)&local_1a8,(OrdType *)&local_88);
  FIX::Message::toString_abi_cxx11_((int)local_3f0,(int)&local_300,8);
  gettimeofday(&local_3d0,(__timezone_ptr_t)0x0);
  _Var3 = local_3d0.tv_usec;
  _Var2 = local_3d0.tv_sec;
  if (0 < count) {
    do {
      FIX::Message::setString
                ((string *)&local_300,SUB81(local_3f0,0),(DataDictionary *)0x1,
                 (DataDictionary *)
                 s_dataDictionary._M_t.
                 super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
                 .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl);
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_3d0,(__timezone_ptr_t)0x0);
  if (local_3f0[0] != local_3e0) {
    operator_delete(local_3f0[0],local_3e0[0] + 1);
  }
  lVar4 = SUB168(SEXT816(_Var3) * SEXT816(-0x20c49ba5e353f7cf),8);
  FIX::Message::~Message((Message *)&local_300);
  FIX::FieldBase::~FieldBase(&local_88);
  FIX::FieldBase::~FieldBase(&local_1a8);
  FIX::FieldBase::~FieldBase(&local_148);
  FIX::FieldBase::~FieldBase((FieldBase *)local_3c0);
  FIX::FieldBase::~FieldBase(&local_e8);
  FIX::FieldBase::~FieldBase((FieldBase *)local_360);
  return (local_3d0.tv_sec - _Var2) * 1000 +
         ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_3d0.tv_usec / 1000;
}

Assistant:

long testSerializeFromStringAndValidateNewOrderSingle( int count )
{
  FIX::ClOrdID clOrdID( "ORDERID" );
  FIX::HandlInst handlInst( '1' );
  FIX::Symbol symbol( "LNUX" );
  FIX::Side side( FIX::Side_BUY );
  FIX::TransactTime transactTime;
  FIX::OrdType ordType( FIX::OrdType_MARKET );
  FIX42::NewOrderSingle message
    ( clOrdID, handlInst, symbol, side, transactTime, ordType );
  std::string string = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    message.setString( string, VALIDATE, s_dataDictionary.get() );
  }
  return GetTickCount() - start;
}